

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

uint32_t duckdb_snappy::anon_unknown_3::CalculateTableSize(uint32_t input_size)

{
  int iVar1;
  uint32_t uVar2;
  
  uVar2 = 0x8000;
  if ((input_size < 0x8001) && (uVar2 = 0x100, 0xff < input_size)) {
    iVar1 = 0x1f;
    if (input_size - 1 != 0) {
      for (; input_size - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar2 = 2 << ((byte)iVar1 & 0x1f);
  }
  return uVar2;
}

Assistant:

uint32_t CalculateTableSize(uint32_t input_size) {
  static_assert(
      kMaxHashTableSize >= kMinHashTableSize,
      "kMaxHashTableSize should be greater or equal to kMinHashTableSize.");
  if (input_size > kMaxHashTableSize) {
    return kMaxHashTableSize;
  }
  if (input_size < kMinHashTableSize) {
    return kMinHashTableSize;
  }
  // This is equivalent to Log2Ceiling(input_size), assuming input_size > 1.
  // 2 << Log2Floor(x - 1) is equivalent to 1 << (1 + Log2Floor(x - 1)).
  return 2u << Bits::Log2Floor(input_size - 1);
}